

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCtrlSystem.cpp
# Opt level: O1

int __thiscall CCtrlSystem::isExist(CCtrlSystem *this,int *id)

{
  long lVar1;
  
  if ((long)this->_size != 0) {
    lVar1 = 0;
    do {
      if (*id == this->_p_workerArray[lVar1]->_id) {
        return (int)lVar1;
      }
      lVar1 = lVar1 + 1;
    } while (this->_size != lVar1);
  }
  return -1;
}

Assistant:

int CCtrlSystem::isExist(const int& id) const
{
	int index = -1; // ***************important*****************
	for (size_t i = 0; i < this->_size; i++)
	{
		if (id == this->_p_workerArray[i]->_id)
		{
			index = i;
			break;
		}
	}
	return index;
}